

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O3

void __thiscall
KktChStep::addChange(KktChStep *this,int type,int row,int col,double valC,double dualC,double dualR)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  double *pdVar4;
  long lVar5;
  pointer pdVar6;
  int iVar7;
  int iVar8;
  _Elt_pointer pvVar9;
  int *piVar10;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> upd;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_38;
  double local_18;
  
  local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0x78 < type) {
    if (0xab < type) {
      if (type == 0xac) {
        piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar7 = piVar2[row];
        iVar1 = piVar2[(long)row + 1];
        iVar8 = iVar7;
        if (iVar7 < iVar1) {
          piVar10 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + iVar7;
          do {
            iVar8 = iVar7;
            if (*piVar10 == col) break;
            iVar7 = iVar7 + 1;
            piVar10 = piVar10 + 1;
            iVar8 = iVar1;
          } while (iVar1 != iVar7);
        }
        (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = valC;
        return;
      }
      if (type != 0xad) {
        return;
      }
      piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = piVar2[row];
      iVar1 = piVar2[(long)row + 1];
      iVar8 = iVar7;
      if (iVar7 < iVar1) {
        piVar10 = piVar3 + iVar7;
        do {
          iVar8 = iVar7;
          if (*piVar10 == col) break;
          iVar7 = iVar7 + 1;
          piVar10 = piVar10 + 1;
          iVar8 = iVar1;
        } while (iVar1 != iVar7);
      }
      (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar8] = valC;
      piVar3[iVar8] = (int)dualC;
      return;
    }
    if (type == 0x79) {
      (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[col] = dualC;
      return;
    }
    if (type != 0xab) {
      return;
    }
    pvVar9 = (this->rLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->rUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
    goto LAB_0015176d;
  }
  switch(type) {
  case 0:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    return;
  case 1:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    if ((valC == 0.0) && (!NAN(valC))) {
      return;
    }
    pvVar9 = (this->cLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->cUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) break;
    lVar5 = (long)local_38.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_38.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar6 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pdVar4 = &(local_38.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
      pdVar4 = pdVar4 + 2;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    goto LAB_00151772;
  case 2:
    lVar5 = (long)col;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] = dualC;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = 1;
    pdVar6 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    goto LAB_0015130b;
  case 3:
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    if ((valC == 0.0) && (!NAN(valC))) {
      return;
    }
    pvVar9 = (this->rLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->rUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
    break;
  case 4:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    pvVar9 = (this->costs).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->costs).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->costs).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->costs).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
    break;
  case 5:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    pvVar9 = (this->cLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->cUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->costs).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->costs).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->costs).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->costs).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
    break;
  case 6:
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    if ((valC == 0.0) && (!NAN(valC))) {
      return;
    }
    pvVar9 = (this->rLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->rUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
    break;
  case 7:
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    if ((valC == 0.0) && (!NAN(valC))) {
      return;
    }
    pvVar9 = (this->rLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->rUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
    break;
  default:
    goto switchD_0015096d_caseD_8;
  case 0xb:
    pvVar9 = (this->rLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    local_18 = dualR;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->rUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = local_18;
    break;
  case 0xc:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    pvVar9 = (this->cLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->cUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->costs).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->costs).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->costs).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->costs).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
    break;
  case 0x11:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    pvVar9 = (this->cLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->cUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->costs).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->costs).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->costs).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->costs).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
    break;
  case 0x15:
    lVar5 = (long)row;
    pdVar6 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
LAB_0015130b:
    pdVar6[lVar5] = dualR;
    return;
  case 0x16:
    pvVar9 = (this->rLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rLowers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pvVar9 = (this->rUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_38,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rUppers).c);
    if ((long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar6 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pdVar4 = &(local_38.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        pdVar6[((pair<int,_double> *)(pdVar4 + -1))->first] = *pdVar4;
        pdVar4 = pdVar4 + 2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      goto LAB_00151772;
    }
  }
LAB_0015176d:
  if (local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_00151772:
    operator_delete(local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
switchD_0015096d_caseD_8:
  return;
}

Assistant:

void KktChStep::addChange(int type, int row, int col, double valC, double dualC, double dualR) {
//when updating fill new values for b, c, bounds in Rb RcolCost RcolUpper, RcolLower
	vector<pair<int, double>> upd;
	
	switch(type) {
	case 171: //new bounds from doubleton equation, retrieve old ones
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		break;
	case 172:{ //matrix transformation from doubleton equation, retrieve old value
		//here col is x, the value of which we are changing back.
		//valC is the old value of the x entry in the matrix
		int i = ARstart[row];
		while (i<ARstart[row+1] && ARindex[i]!= col) i++;
		ARvalue[i] = valC;
		break;
	}
	case 173:{ //matrix transformation from doubleton equation, retrieve old value
		//here col is x, the value of which we are changing back.
		//valC is the old value of the x entry in the matrix
		int i = ARstart[row];
		while (i<ARstart[row+1] && ARindex[i]!= col) i++;
		ARvalue[i] = valC;
		ARindex[i] = (int) dualC;
		break;
	}
	case 0:  //empty row
		flagRow[row] = 1;
		break;
	case 1:  //row singleton
		flagRow[row] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		if (valC != 0) {
			upd =  cLowers.top();
			cLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RcolLower[ind] = get<1>(upd[i]);
			}
			upd =  cUppers.top();
			cUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RcolUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 2: //each variable at forcing row: rowDual is cost here
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		RcolCost[col] = dualR;
		break;
	case 21: //
		rowDual[row] = dualR;
		break;
	case 22: //
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		break;
	case 3: //the row that is forcing 
		rowDual[row] = dualR;
		flagRow[row] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 4: //implied free column singleton (also from duplicate row)
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 5: //doubleton eq with singleton col
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 17: {//doubleton equation
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	}
	case 6: //empty column, dominated column or weakly dominated
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 7: //fixed variable
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 11: //empty row from duplucate rows
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		flagRow[row] = 1;
		rowDual[row] = dualR;
		break;
	case 12: //doubleton eq from dupliocate rows;
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
				upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 121: //
		colDual[col] = dualC;
		break;/*
	case 14: //two duplicate columns by one 
		colValue[col] = valC;
		colDual[col] = dualC;
		RcolLower = cLowers.top(); cLowers.pop();
		RcolUpper = cUppers.top(); cUppers.pop();
		break;
	case 15: //sing variable on initEq
		flagRow[row] = true;
		rowDual[row] = dualR;
		break;*/
	}
}